

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::iterate
          (OperatorPerformanceCase *this)

{
  TheilSenCalibrator *this_00;
  float *pfVar1;
  pointer *ppVVar2;
  pointer *ppVVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  CaseType CVar9;
  pointer pVVar10;
  long lVar11;
  pointer pWVar12;
  TestContext *this_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  LineParameters LVar15;
  pointer pSVar16;
  pointer pSVar17;
  undefined1 auVar18 [16];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *pvVar19;
  undefined1 auVar20 [12];
  _Alloc_hider _Var21;
  State SVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 extraout_EAX;
  deUint64 dVar25;
  ulong uVar26;
  _Rb_tree_node_base *p_Var27;
  pointer __p;
  pointer pSVar28;
  pointer pSVar29;
  pointer pSVar30;
  pointer pSVar31;
  pointer pWVar32;
  SampleBuilder *pSVar33;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Var34;
  ulong uVar35;
  MessageBuilder *pMVar36;
  InternalError *pIVar37;
  TestError *this_02;
  vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  *pvVar38;
  pointer pSVar39;
  LogNumber<long> *pLVar40;
  LogNumber<float> *unit;
  string *psVar41;
  int precision;
  size_t __n;
  size_t extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  LineParameters *params;
  LineParameters *params_00;
  LineParameters *params_01;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  int i_1;
  IterateResult IVar42;
  pointer pSVar43;
  pointer pvVar44;
  ulong uVar45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pointer *ppSVar46;
  char *pcVar47;
  long lVar48;
  int i;
  long lVar49;
  int i_2;
  long lVar50;
  undefined1 *puVar51;
  pointer pcVar52;
  int *piVar53;
  int i_3;
  pointer pWVar54;
  bool bVar55;
  float fVar56;
  float value_00;
  float fVar57;
  int iVar58;
  float fVar59;
  float fVar60;
  int iVar61;
  undefined4 extraout_XMM0_Dc;
  float fVar62;
  undefined4 extraout_XMM0_Dd;
  float fVar63;
  LineParameters LVar64;
  double dVar65;
  undefined1 local_8a8 [4];
  undefined1 auStack_8a4 [4];
  LineParameters LStack_8a0;
  pointer local_890;
  allocator<char> local_87a;
  allocator<char> local_879;
  allocator<char> local_878;
  allocator<char> local_877;
  allocator<char> local_876;
  allocator<char> local_875;
  allocator<char> local_874;
  allocator<char> local_873;
  allocator<char> local_872;
  allocator<char> local_871;
  allocator<char> local_870;
  allocator<char> local_86f;
  allocator<char> local_86e;
  allocator<char> local_86d;
  allocator<char> local_86c;
  allocator<char> local_86b;
  allocator<char> local_86a;
  allocator<char> local_869;
  vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
  local_868;
  undefined1 local_848 [8];
  float fStack_840;
  float fStack_83c;
  string local_830;
  OperatorPerformanceCase *local_810;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  pointer local_768;
  string local_760;
  string local_740;
  Vec2 mid;
  LogNumber<long> local_6b8;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  ScopedLogSection section;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  LogNumber<float> local_320;
  vector<float,_std::allocator<float>_> perProgramSlopes;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData_1;
  
  this_00 = &this->m_calibrator;
  SVar22 = deqp::gls::TheilSenCalibrator::getState(this_00);
  IVar42 = CONTINUE;
  if (SVar22 == STATE_FINISHED) {
    if (this->m_state - STATE_FIND_HIGH_WORKLOAD < 2) {
      if (this->m_workloadMeasurementNdx < this->m_numMeasurementsPerWorkload) {
        pvVar38 = &this->m_workloadRecords;
        if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
          pvVar38 = &this->m_workloadRecordsFindHigh;
        }
        pWVar54 = (pvVar38->
                  super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->m_measureProgramNdx].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        dVar25 = renderAndMeasure(this,(this->m_calibrator).m_measureState.numDrawCalls);
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(leftData.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,(float)dVar25);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&pWVar54[-1].frameTimes,(value_type_conflict2 *)&leftData);
        this->m_workloadMeasurementNdx = this->m_workloadMeasurementNdx + 1;
      }
      else {
        prepareNextRound(this);
      }
    }
    else {
      pVVar10 = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      iVar58 = (this->m_calibrator).m_measureState.numDrawCalls;
      local_868.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_868.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_868.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVVar2 = &leftData.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pSVar28 = (pointer)0x0;
      lVar48 = 0;
      pSVar43 = (pointer)0x0;
      local_810 = this;
      while( true ) {
        pSVar39 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar31 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((int)((ulong)((long)pSVar31 - (long)pSVar39) >> 4) <= lVar48) break;
        pvVar44 = (this->m_workloadRecords).
                  super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar48;
        result.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar50 = 0;
        local_768 = pSVar28;
        for (lVar49 = 0;
            lVar11 = *(long *)&(pvVar44->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                               )._M_impl.super__Vector_impl_data,
            lVar49 < (int)((ulong)((long)(pvVar44->
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - lVar11) >> 5)
            ; lVar49 = lVar49 + 1) {
          iVar61 = *(int *)(lVar11 + lVar50);
          fVar57 = WorkloadRecord::getMedianTime((WorkloadRecord *)(lVar11 + lVar50));
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar57,(float)iVar61);
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>
                    ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&result,
                     (Vector<float,_2> *)&leftData);
          lVar50 = lVar50 + 0x20;
        }
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)leftData.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (lVar49 = 0;
            lVar49 < (int)((ulong)((long)result.
                                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)result.
                                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
            lVar49 = lVar49 + 1) {
          leftData_1.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start =
               (pointer)CONCAT44(leftData_1.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 result.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar49].m_data[0]);
          std::
          _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
          _M_insert_unique<float>
                    ((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                      *)&leftData,(float *)&leftData_1);
        }
        fVar59 = INFINITY;
        fVar57 = -INFINITY;
        for (p_Var27 = (_Rb_tree_node_base *)ppVVar2; p_Var27 != (_Rb_tree_node_base *)ppVVar2;
            p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27)) {
          leftData_1.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_6b8.m_name.field_2._M_allocated_capacity = 0;
          leftData_1.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          leftData_1.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_6b8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_6b8.m_name._M_string_length = 0;
          lVar49 = 0;
          for (lVar50 = 0;
              lVar50 < (int)((ulong)((long)result.
                                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)result.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
              lVar50 = lVar50 + 1) {
            pfVar1 = (float *)((long)(result.
                                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar49);
            pLVar40 = (LogNumber<long> *)&leftData_1;
            if ((float)p_Var27[1]._M_color < *pfVar1 || (float)p_Var27[1]._M_color == *pfVar1) {
              pLVar40 = &local_6b8;
            }
            std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       pLVar40,(value_type *)
                               ((long)(result.
                                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar49))
            ;
            lVar49 = lVar49 + 8;
          }
          iVar61 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)&local_6b8);
          if (2 < iVar61) {
            iVar23 = numDistinctX(&leftData_1);
            auVar20 = _auStack_8a4;
            auVar18._12_4_ = 0;
            auVar18._0_12_ = _auStack_8a4;
            _local_8a8 = auVar18 << 0x20;
            if (2 < iVar23) {
              mean<2>((Performance *)&mid,&leftData_1);
              uVar26 = (long)leftData_1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)leftData_1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
              uVar35 = 0;
              if (0 < (int)uVar26) {
                uVar35 = uVar26 & 0xffffffff;
              }
              local_8a8 = (undefined1  [4])0x0;
              for (uVar45 = 0; uVar35 != uVar45; uVar45 = uVar45 + 1) {
                fVar63 = mid.m_data[1] -
                         leftData_1.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar45].m_data[1];
                local_8a8 = (undefined1  [4])((float)local_8a8 + fVar63 * fVar63);
              }
              local_8a8 = (undefined1  [4])((float)local_8a8 / (float)uVar26);
              _local_8a8 = CONCAT124(auVar20,local_8a8);
            }
            iVar23 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                   *)&local_6b8);
            fVar63 = 0.0;
            if (2 < iVar23) {
              mean<2>((Performance *)&mid,
                      (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      &local_6b8);
              fVar56 = 0.0;
              fVar60 = 0.0;
              fVar63 = 0.0;
              fVar62 = 0.0;
              lVar49 = 0;
              for (lVar50 = 0;
                  lVar50 < (int)(local_6b8.m_name._M_string_length -
                                 (long)local_6b8.m_name._M_dataplus._M_p >> 3); lVar50 = lVar50 + 1)
              {
                local_848._4_4_ = fVar60;
                local_848._0_4_ = fVar56;
                fStack_840 = fVar63;
                fStack_83c = fVar62;
                tcu::operator-((Vector<float,_2> *)(local_6b8.m_name._M_dataplus._M_p + lVar49),&mid
                              );
                fVar62 = SUB84(local_320.m_name._M_dataplus._M_p,0);
                fVar56 = (float)local_848._0_4_ + fVar62 * fVar62;
                fVar60 = (float)local_848._4_4_ +
                         fVar62 * (float)((ulong)local_320.m_name._M_dataplus._M_p >> 0x20);
                fVar63 = fStack_840 + fVar62 * 0.0;
                fVar62 = fStack_83c + fVar62 * 0.0;
                lVar49 = lVar49 + 8;
              }
              uVar26 = (long)(local_6b8.m_name._M_string_length -
                             (long)local_6b8.m_name._M_dataplus._M_p) >> 3;
              uVar35 = 0;
              if (0 < (int)uVar26) {
                uVar35 = uVar26 & 0xffffffff;
              }
              fVar63 = 0.0;
              for (uVar45 = 0; uVar35 != uVar45; uVar45 = uVar45 + 1) {
                fVar62 = (*(float *)(local_6b8.m_name._M_dataplus._M_p + uVar45 * 8) *
                          (fVar60 / fVar56) + (mid.m_data[1] - mid.m_data[0] * (fVar60 / fVar56))) -
                         *(float *)(local_6b8.m_name._M_dataplus._M_p + uVar45 * 8 + 4);
                fVar63 = fVar63 + fVar62 * fVar62;
              }
              fVar63 = fVar63 / (float)uVar26;
            }
            if ((float)local_8a8 + fVar63 < fVar59) {
              fVar57 = (float)p_Var27[1]._M_color;
              fVar59 = (float)local_8a8 + fVar63;
            }
          }
          std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
          ~_Vector_base((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         *)&local_6b8);
          std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
          ~_Vector_base((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         *)&leftData_1);
          if (iVar61 < 3) break;
        }
        std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
        ::~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                     *)&leftData);
        this = local_810;
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        leftData_1.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        leftData_1.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        leftData_1.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar49 = 0;
        for (lVar50 = 0;
            lVar50 < (int)((ulong)((long)result.
                                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)result.
                                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
            lVar50 = lVar50 + 1) {
          pfVar1 = (float *)((long)(result.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar49);
          pLVar40 = (LogNumber<long> *)&leftData;
          if (fVar57 < *pfVar1 || fVar57 == *pfVar1) {
            pLVar40 = (LogNumber<long> *)&leftData_1;
          }
          std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     pLVar40,(value_type *)
                             ((long)(result.
                                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar49));
          lVar49 = lVar49 + 8;
        }
        LVar64 = deqp::gls::theilSenLinearRegression(&leftData);
        LVar15 = deqp::gls::theilSenLinearRegression(&leftData_1);
        fStack_840 = (float)extraout_XMM0_Dc;
        local_848._0_4_ = LVar15.offset;
        local_848._4_4_ = LVar15.coefficient;
        fStack_83c = (float)extraout_XMM0_Dd;
        iVar61 = numDistinctX(&leftData);
        if (iVar61 < 2) {
LAB_011a0648:
          LVar64 = deqp::gls::theilSenLinearRegression(&result);
          local_8a8 = (undefined1  [4])LVar64.offset;
          auStack_8a4 = (undefined1  [4])0x0;
          fVar57 = -INFINITY;
        }
        else {
          auStack_8a4 = (undefined1  [4])LVar64.coefficient;
          if ((float)local_848._4_4_ * 0.5 < (float)auStack_8a4) goto LAB_011a0648;
          local_8a8 = (undefined1  [4])LVar64.offset;
          LVar64 = (LineParameters)local_848;
        }
        LStack_8a0.offset = LVar64.offset;
        LStack_8a0.coefficient = LVar64.coefficient;
        std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
        ~_Vector_base((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       *)&leftData_1);
        std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
        ~_Vector_base(&leftData.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     );
        if (local_768 ==
            local_868.
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          lVar49 = (long)local_768 - (long)pSVar43;
          if (lVar49 == 0x7ffffffffffffff8) {
            local_868.
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar43;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)(lVar49 / 0x14);
          __n = lVar49 % 0x14;
          pSVar28 = __p;
          if (local_768 == pSVar43) {
            pSVar28 = (pointer)&DAT_00000001;
          }
          puVar51 = (undefined1 *)((long)&pSVar28->pivotX + (long)__p);
          if ((undefined1 *)0x666666666666665 < puVar51) {
            puVar51 = (undefined1 *)0x666666666666666;
          }
          if (CARRY8((ulong)pSVar28,(ulong)__p)) {
            puVar51 = (undefined1 *)0x666666666666666;
          }
          if (puVar51 == (undefined1 *)0x0) {
            pSVar29 = (pointer)0x0;
          }
          else {
            pSVar29 = (pointer)operator_new((long)puVar51 * 0x14);
            __n = extraout_RDX;
          }
          pSVar29[(long)__p].pivotX = fVar57;
          pSVar29[(long)__p].left = _local_8a8;
          (&pSVar29[(long)__p].left)[1] = LStack_8a0;
          pSVar16 = pSVar29;
          for (pSVar30 = pSVar43; pSVar28 = pSVar16 + 1, pSVar30 != local_768; pSVar30 = pSVar30 + 1
              ) {
            uVar8 = (uint)(pSVar30->right).coefficient;
            __n = (size_t)uVar8;
            (pSVar16->right).coefficient = (float)uVar8;
            fVar57 = (pSVar30->left).offset;
            pSVar17 = *(pointer *)&(pSVar30->left).coefficient;
            pSVar16->pivotX = pSVar30->pivotX;
            (pSVar16->left).offset = fVar57;
            *(pointer *)&(pSVar16->left).coefficient = pSVar17;
            pSVar16 = pSVar28;
          }
          std::
          _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
          ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                           *)pSVar43,__p,__n);
          local_868.
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar29 + (long)puVar51;
          this = local_810;
        }
        else {
          *(float *)&(((_Vector_impl *)&local_768->pivotX)->super__Vector_impl_data)._M_start =
               fVar57;
          local_768->left = _local_8a8;
          local_768->right = LStack_8a0;
          pSVar28 = local_768 + 1;
          pSVar29 = pSVar43;
        }
        local_868.
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar28;
        std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
        ~_Vector_base(&result.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     );
        lVar48 = lVar48 + 1;
        pSVar43 = pSVar29;
      }
      local_5c8._M_dataplus._M_p._0_4_ = 0;
      local_868.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar43;
      while( true ) {
        pSVar43 = local_868.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = (ulong)((long)pSVar31 - (long)pSVar39) >> 4;
        iVar61 = (int)uVar26;
        iVar23 = (int)pVVar10;
        if (iVar61 <= (int)local_5c8._M_dataplus._M_p) break;
        pSVar43 = local_868.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                  ._M_impl.super__Vector_impl_data._M_start + (int)local_5c8._M_dataplus._M_p;
        value = &local_5c8;
        de::toString<int>((string *)&result,(int *)value);
        lVar48 = (long)(int)local_5c8._M_dataplus._M_p;
        pvVar44 = (this->m_workloadRecords).
                  super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar49 = (long)pvVar44[lVar48].
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 *(long *)&pvVar44[lVar48].
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                           ._M_impl.super__Vector_impl_data;
        pWVar32 = std::
                  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ::_M_allocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                 *)(lVar49 >> 5),(size_t)value);
        local_7e8.field_2._M_allocated_capacity = lVar49 + (long)pWVar32;
        pWVar54 = pvVar44[lVar48].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pWVar12 = pvVar44[lVar48].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_848 = (undefined1  [8])((long)pWVar32 * -0x8000000);
        lVar48 = -(long)pWVar32;
        local_890 = pWVar32;
        local_7e8._M_dataplus._M_p = (pointer)pWVar32;
        local_7e8._M_string_length = (size_type)pWVar32;
        for (; _Var21._M_p = local_7e8._M_dataplus._M_p, pWVar54 != pWVar12; pWVar54 = pWVar54 + 1)
        {
          pWVar32->workloadSize = pWVar54->workloadSize;
          std::vector<float,_std::allocator<float>_>::vector
                    (&pWVar32->frameTimes,&pWVar54->frameTimes);
          pWVar32 = pWVar32 + 1;
          local_848 = (undefined1  [8])((long)local_848 + -0x100000000);
          lVar48 = lVar48 + -0x20;
          local_890 = local_890 + 1;
        }
        _local_8a8 = (LineParameters)local_7e8._M_dataplus._M_p;
        local_7e8._M_string_length = (size_type)pWVar32;
        if (pWVar32 != (pointer)local_7e8._M_dataplus._M_p) {
          pcVar52 = local_7e8._M_dataplus._M_p + lVar48;
          uVar26 = -(long)pcVar52 >> 5;
          lVar48 = 0x3f;
          if (uVar26 != 0) {
            for (; uVar26 >> lVar48 == 0; lVar48 = lVar48 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_7e8._M_dataplus._M_p,pWVar32,((uint)lVar48 ^ 0x3f) * 2 ^ 0x7e);
          if (-(long)pcVar52 < 0x201) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var21._M_p,pWVar32);
          }
          else {
            pWVar54 = (pointer)(_Var21._M_p + 0x200);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var21._M_p,pWVar54);
            for (; pWVar54 != pWVar32; pWVar54 = pWVar54 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Val_less_iter>
                        (pWVar54);
            }
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &leftData_1,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &leftData,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &leftData_1,"Measurements");
        std::operator+(&local_6b8.m_name,"Measurements for program ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result)
        ;
        pLVar40 = &local_6b8;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section,(TestLog *)pVVar10,(string *)&leftData,&local_6b8.m_name);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&leftData);
        std::__cxx11::string::~string((string *)&leftData_1);
        std::operator+(&local_320.m_name,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mid,
                       &local_320.m_name,"IndividualFrameTimes");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_808,"Individual frame times",(allocator<char> *)&local_340);
        tcu::LogSampleList::LogSampleList((LogSampleList *)&local_6b8,(string *)&mid,&local_808);
        tcu::LogSampleList::write((LogSampleList *)&local_6b8,iVar23,__buf,(size_t)pLVar40);
        tcu::TestLog::startSampleInfo((TestLog *)pVVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_830,"Workload",(allocator<char> *)&local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_788,"Workload",(allocator<char> *)&local_380);
        psVar41 = &local_740;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar41,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_3a0);
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&leftData,&local_830,&local_788,psVar41,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write((LogValueInfo *)&leftData,iVar23,__buf_00,(size_t)psVar41);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a8,"FrameTime",(allocator<char> *)&local_3c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7c8,"Frame time",(allocator<char> *)&local_3e0);
        psVar41 = &local_760;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar41,"us",(allocator<char> *)&local_400);
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&leftData_1,&local_7a8,&local_7c8,psVar41,
                   QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write((LogValueInfo *)&leftData_1,iVar23,__buf_01,(size_t)psVar41);
        tcu::TestLog::endSampleInfo((TestLog *)pVVar10);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&leftData_1);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a8);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&leftData);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_788);
        std::__cxx11::string::~string((string *)&local_830);
        tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&mid);
        std::__cxx11::string::~string((string *)&local_320);
        lVar49 = (long)_Var21._M_p * 0x8000000 + (long)local_848;
        for (lVar48 = 0; lVar48 < -lVar49 >> 0x20; lVar48 = lVar48 + 1) {
          piVar53 = (int *)(_Var21._M_p + lVar48 * 0x20);
          for (lVar50 = 0;
              lVar50 < (int)((ulong)(*(long *)(piVar53 + 4) - *(long *)(piVar53 + 2)) >> 2);
              lVar50 = lVar50 + 1) {
            leftData.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            leftData.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            leftData.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pVVar10;
            pSVar33 = tcu::SampleBuilder::operator<<((SampleBuilder *)&leftData,*piVar53);
            psVar41 = *(string **)(piVar53 + 2);
            pSVar33 = tcu::SampleBuilder::operator<<
                                (pSVar33,*(float *)((long)&(psVar41->_M_dataplus)._M_p + lVar50 * 4)
                                );
            tcu::SampleBuilder::operator<<(pSVar33,(EndSampleToken *)&tcu::TestLog::EndSample);
            std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
            ::~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                             *)ppVVar2);
          }
        }
        tcu::TestLog::endSampleList((TestLog *)pVVar10);
        std::operator+(&local_320.m_name,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mid,
                       &local_320.m_name,"MedianFrameTimes");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_808,"Median frame times",(allocator<char> *)&local_340);
        tcu::LogSampleList::LogSampleList((LogSampleList *)&local_6b8,(string *)&mid,&local_808);
        tcu::LogSampleList::write((LogSampleList *)&local_6b8,iVar23,__buf_02,(size_t)psVar41);
        tcu::TestLog::startSampleInfo((TestLog *)pVVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_830,"Workload",(allocator<char> *)&local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_788,"Workload",(allocator<char> *)&local_380);
        psVar41 = &local_740;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar41,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_3a0);
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&leftData,&local_830,&local_788,psVar41,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write((LogValueInfo *)&leftData,iVar23,__buf_03,(size_t)psVar41);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a8,"MedianFrameTime",(allocator<char> *)&local_3c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7c8,"Median frame time",(allocator<char> *)&local_3e0);
        psVar41 = &local_760;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar41,"us",(allocator<char> *)&local_400);
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&leftData_1,&local_7a8,&local_7c8,psVar41,
                   QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write((LogValueInfo *)&leftData_1,iVar23,__buf_04,(size_t)psVar41);
        tcu::TestLog::endSampleInfo((TestLog *)pVVar10);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&leftData_1);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7a8);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&leftData);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_788);
        std::__cxx11::string::~string((string *)&local_830);
        tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&mid);
        std::__cxx11::string::~string((string *)&local_320);
        uVar26 = (ulong)((long)local_890 - (long)_Var21._M_p) >> 5;
        uVar35 = uVar26 & 0xffffffff;
        if ((int)uVar26 < 1) {
          uVar35 = 0;
        }
        while (bVar55 = uVar35 != 0, uVar35 = uVar35 - 1, bVar55) {
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = pVVar10;
          pSVar33 = tcu::SampleBuilder::operator<<
                              ((SampleBuilder *)&leftData,
                               ((WorkloadRecord *)_local_8a8)->workloadSize);
          fVar57 = WorkloadRecord::getMedianTime((WorkloadRecord *)_local_8a8);
          pSVar33 = tcu::SampleBuilder::operator<<(pSVar33,fVar57);
          tcu::SampleBuilder::operator<<(pSVar33,(EndSampleToken *)&tcu::TestLog::EndSample);
          std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
          ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                         *)ppVVar2);
          _local_8a8 = (LineParameters)((long)_local_8a8 + 0x20);
        }
        tcu::TestLog::endSampleList((TestLog *)pVVar10);
        std::operator+(&local_6b8.m_name,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &leftData_1,&local_6b8.m_name,"WorkloadCostEstimate");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mid,"Workload cost estimate",(allocator<char> *)&local_808);
        unit = &local_320;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)unit,"us / workload",(allocator<char> *)&local_830);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&leftData,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&leftData_1,
                   (string *)&mid,&unit->m_name,QP_KEY_TAG_TIME,(pSVar43->right).coefficient);
        this = local_810;
        tcu::LogNumber<float>::write((LogNumber<float> *)&leftData,iVar23,__buf_05,(size_t)unit);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&leftData);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&mid);
        std::__cxx11::string::~string((string *)&leftData_1);
        std::__cxx11::string::~string((string *)&local_6b8);
        if (pSVar43->pivotX == -INFINITY) {
          ppVVar3 = &leftData.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = pVVar10;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar3);
          std::operator<<((ostream *)ppVVar3,"Note: the data seem to form a single line: ");
          lineParamsString_abi_cxx11_
                    ((string *)&leftData_1,(Performance *)&pSVar43->right,params_01);
          std::operator<<((ostream *)
                          &leftData.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(string *)&leftData_1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&leftData_1);
          pvVar19 = &leftData;
        }
        else {
          ppVVar3 = &leftData_1.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          leftData_1.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = pVVar10;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar3);
          std::operator<<((ostream *)ppVVar3,
                          "Note: the data points with x coordinate greater than or equal to ");
          pMVar36 = tcu::MessageBuilder::operator<<((MessageBuilder *)&leftData_1,&pSVar43->pivotX);
          std::operator<<(&(pMVar36->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " seem to form a rising line, and the rest of data points seem to form a near-horizontal line"
                         );
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start =
               (pointer)tcu::MessageBuilder::operator<<
                                  (pMVar36,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &leftData.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::operator<<((ostream *)
                          &leftData.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                          "Note: the left line is estimated to be ");
          lineParamsString_abi_cxx11_(&local_6b8.m_name,(Performance *)&pSVar43->left,params);
          ppVVar3 = &leftData.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::operator<<((ostream *)ppVVar3,(string *)&local_6b8);
          std::operator<<((ostream *)ppVVar3," and the right line ");
          lineParamsString_abi_cxx11_((string *)&mid,(Performance *)&pSVar43->right,params_00);
          std::operator<<((ostream *)
                          &leftData.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(string *)&mid);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&mid);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &leftData.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          pvVar19 = &leftData_1;
        }
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &(pvVar19->
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
        tcu::ScopedLogSection::~ScopedLogSection(&section);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                   *)&local_7e8);
        std::__cxx11::string::~string((string *)&result);
        local_5c8._M_dataplus._M_p._0_4_ = (int)local_5c8._M_dataplus._M_p + 1;
        pSVar39 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar31 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar35 = 0;
      uVar26 = uVar26 & 0xffffffff;
      if (iVar61 < 1) {
        uVar26 = uVar35;
      }
      ppSVar46 = (pointer *)
                 &((local_868.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                    ._M_impl.super__Vector_impl_data._M_start)->right).coefficient;
      for (; uVar26 != uVar35; uVar35 = uVar35 + 1) {
        if (*(float *)ppSVar46 <= 0.0) {
          ppVVar2 = &leftData.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          leftData.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start = pVVar10;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
          std::operator<<((ostream *)ppVVar2,"Slope of measurements for program ");
          std::ostream::operator<<(ppVVar2,(int)uVar35);
          std::operator<<((ostream *)ppVVar2," isn\'t positive. Can\'t get sensible result.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
          pIVar37 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar37,"Unable to get sensible measurements for estimation",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                     ,0x3ea);
          __cxa_throw(pIVar37,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        ppSVar46 = (pointer *)((long)ppSVar46 + 0x14);
      }
      perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ppSVar46 = (pointer *)
                 &((local_868.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                    ._M_impl.super__Vector_impl_data._M_start)->right).coefficient;
      for (lVar48 = 0; lVar48 < (int)((ulong)((long)pSVar31 - (long)pSVar39) >> 4);
          lVar48 = lVar48 + 1) {
        std::vector<float,_std::allocator<float>_>::push_back
                  (&perProgramSlopes,(value_type_conflict2 *)ppSVar46);
        pSVar39 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar31 = (this->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppSVar46 = (pointer *)((long)ppSVar46 + 0x14);
      }
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])(this);
      _Var34 = std::
               __max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_finish);
      fVar57 = *_Var34._M_current;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(this,&perProgramSlopes);
      if (this->m_caseType == CASETYPE_VERTEX) {
        iVar61 = this->m_gridSizeX * this->m_gridSizeY * 6;
      }
      else {
        iVar61 = this->m_viewportHeight * this->m_viewportWidth;
      }
      fVar59 = floorf(((pSVar43->left).offset - (pSVar43->right).offset) /
                      (value_00 - (pSVar43->left).coefficient));
      uVar26 = 0;
      if (0 < (int)fVar59) {
        uVar26 = (ulong)(uint)(int)fVar59;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"VertexOrFragmentCount",&local_869);
      pcVar47 = "Fragment";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar47 = "Vertex";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,pcVar47,&local_86a);
      std::operator+(&local_788,"R = ",&local_740);
      std::operator+(&local_830,&local_788," count");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,glcts::fixed_sample_locations_values + 1,&local_86b);
      psVar41 = &local_7a8;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)&leftData,&local_808,&local_830,psVar41,QP_KEY_TAG_NONE,
                 (long)iVar61);
      tcu::LogNumber<long>::write((LogNumber<long> *)&leftData,iVar23,__buf_06,(size_t)psVar41);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8,"DrawCallsPerFrame",&local_86c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_760,"D = Draw calls per frame",&local_86d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,glcts::fixed_sample_locations_values + 1,&local_86e);
      psVar41 = &local_7e8;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)&leftData_1,&local_7c8,&local_760,psVar41,QP_KEY_TAG_NONE,
                 (long)iVar58);
      tcu::LogNumber<long>::write((LogNumber<long> *)&leftData_1,iVar23,__buf_07,(size_t)psVar41);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section,"VerticesOrFragmentsPerFrame",&local_86f);
      pcVar47 = "Fragments";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar47 = "Vertices";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,pcVar47,&local_870);
      std::operator+(&local_340,"R*D = ",&local_360);
      std::operator+(&local_5c8,&local_340," per frame");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,glcts::fixed_sample_locations_values + 1,&local_871);
      psVar41 = &local_380;
      tcu::LogNumber<long>::LogNumber
                (&local_6b8,(string *)&section,&local_5c8,psVar41,QP_KEY_TAG_NONE,
                 (long)(iVar61 * iVar58));
      tcu::LogNumber<long>::write(&local_6b8,iVar23,__buf_08,(size_t)psVar41);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"TimePerFramePerOp",&local_872);
      pcVar47 = "fragments";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar47 = "vertices";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,pcVar47,&local_873);
      std::operator+(&local_3e0,"Estimated cost of R*D ",&local_400);
      std::operator+(&local_3c0,&local_3e0," (i.e. one frame) with one shader operation");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"us",&local_874);
      psVar41 = &local_1d8;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&result,&local_3a0,&local_3c0,psVar41,QP_KEY_TAG_TIME,value_00)
      ;
      tcu::LogNumber<float>::write((LogNumber<float> *)&result,iVar23,__buf_09,(size_t)psVar41);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"TimePerDrawcallPerOp",&local_875);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"Estimated cost of one draw call with one shader operation",
                 &local_876);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"us",&local_877);
      local_848 = (undefined1  [8])(double)value_00;
      dVar65 = (double)value_00 / (double)iVar58;
      psVar41 = &local_238;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&mid,&local_1f8,&local_218,psVar41,QP_KEY_TAG_TIME,
                 (float)dVar65);
      tcu::LogNumber<float>::write((LogNumber<float> *)&mid,iVar23,__buf_10,(size_t)psVar41);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"TimePerSingleOp",&local_878);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"Estimated cost of a single shader operation",&local_879);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"us",&local_87a);
      psVar41 = &local_298;
      tcu::LogNumber<float>::LogNumber
                (&local_320,&local_258,&local_278,psVar41,QP_KEY_TAG_TIME,
                 (float)(dVar65 / (double)iVar61));
      tcu::LogNumber<float>::write(&local_320,iVar23,__buf_11,(size_t)psVar41);
      tcu::LogNumber<float>::~LogNumber(&local_320);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&mid);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&result);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_3a0);
      tcu::LogNumber<long>::~LogNumber(&local_6b8);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&section);
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&leftData_1);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_7c8);
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&leftData);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_830);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_740);
      std::__cxx11::string::~string((string *)&local_808);
      if (value_00 <= fVar57 * -0.1) {
        ppVVar2 = &leftData.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start = pVVar10;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
        std::operator<<((ostream *)ppVVar2,"Got strongly negative result.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
        pIVar37 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar37,"Unable to get sensible measurements for estimation",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                   ,0x428);
        __cxa_throw(pIVar37,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      if ((double)local_848 <= (double)fVar57 * 0.001) {
        ppVVar2 = &leftData.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start = pVVar10;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
        std::operator<<((ostream *)ppVVar2,"Cost of operation seems to be approximately zero.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"OpsPerSecond",(allocator<char> *)&local_788);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"Operations per second",(allocator<char> *)&local_740);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mid,"Million/s",(allocator<char> *)&local_7a8);
        fVar57 = (float)((double)(iVar61 * iVar58) / (double)local_848);
        psVar41 = (string *)&mid;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&leftData_1,&local_6b8.m_name,(string *)&result,psVar41,
                   QP_KEY_TAG_PERFORMANCE,fVar57);
        tcu::LogNumber<float>::write
                  ((LogNumber<float> *)&leftData_1,iVar23,__buf_12,(size_t)psVar41);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,"NumFreeOps",(allocator<char> *)&local_7c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_808,"Estimated number of \"free\" operations",
                   (allocator<char> *)&local_760);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_830,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_7e8);
        psVar41 = &local_830;
        tcu::LogNumber<long>::LogNumber
                  ((LogNumber<long> *)&leftData,&local_320.m_name,&local_808,psVar41,
                   QP_KEY_TAG_PERFORMANCE,uVar26);
        tcu::LogNumber<long>::write((LogNumber<long> *)&leftData,iVar23,__buf_13,(size_t)psVar41);
        tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&leftData);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_320);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&leftData_1);
        std::__cxx11::string::~string((string *)&mid);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&local_6b8);
        this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
        de::floatToString_abi_cxx11_((string *)&leftData,(de *)0x2,fVar57,precision);
        tcu::TestContext::setTestResult
                  (this_01,QP_TEST_RESULT_PASS,
                   (char *)leftData.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&leftData);
      }
      this->m_state = STATE_FINISHED;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ::~vector(&local_868);
      IVar42 = STOP;
    }
  }
  else {
    if (SVar22 == STATE_MEASURE) {
      dVar25 = renderAndMeasure(this,(this->m_calibrator).m_measureState.numDrawCalls);
      deqp::gls::TheilSenCalibrator::recordIteration(this_00,dVar25);
    }
    else if (SVar22 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(this_00);
    }
    SVar22 = deqp::gls::TheilSenCalibrator::getState(this_00);
    if (SVar22 == STATE_FINISHED) {
      deqp::gls::logCalibrationInfo
                (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this_00);
      pVVar10 = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      if ((this->m_calibrator).m_measureState.numDrawCalls == 1) {
        dVar25 = deqp::gls::MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
        uVar35 = (long)(this->m_calibrator).m_measureState.frameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_calibrator).m_measureState.frameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar26 = uVar35;
        if ((long)uVar35 < 0) {
          uVar26 = (ulong)((uint)uVar35 & 1) | uVar35 >> 1;
        }
        uVar24 = (undefined4)uVar26;
        fVar57 = (this->m_calibrator).m_params.targetFrameTimeUs / ((float)dVar25 / (float)uVar35);
        if (fVar57 < 0.95) {
          CVar9 = this->m_caseType;
          if (fVar57 < 0.0) {
            fVar57 = sqrtf(fVar57);
            uVar24 = extraout_EAX;
          }
          else {
            fVar57 = SQRT(fVar57);
          }
          if (CVar9 == CASETYPE_VERTEX) {
            uVar5 = this->m_gridSizeX;
            uVar7 = this->m_gridSizeY;
            iVar58 = (int)(fVar57 * (float)(int)uVar5);
            iVar61 = (int)(fVar57 * (float)(int)uVar7);
            this->m_gridSizeX = iVar58;
            this->m_gridSizeY = iVar61;
            auVar14._4_4_ = -(uint)(0 < iVar58);
            auVar14._0_4_ = -(uint)(0 < iVar58);
            auVar14._8_4_ = -(uint)(0 < iVar61);
            auVar14._12_4_ = -(uint)(0 < iVar61);
            iVar58 = movmskpd(uVar24,auVar14);
            if (iVar58 != 3) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,"Can\'t decrease grid size enough to achieve low-enough draw times"
                         ,"m_gridSizeX >= 1 && m_gridSizeY >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x371);
              goto LAB_011a202f;
            }
            ppVVar2 = &leftData.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            leftData.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pVVar10;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
            std::operator<<((ostream *)ppVVar2,
                            "Note: triangle grid size reduced from original; it\'s now smaller than during calibration."
                           );
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            uVar4 = this->m_viewportWidth;
            uVar6 = this->m_viewportHeight;
            iVar58 = (int)(fVar57 * (float)(int)uVar4);
            iVar61 = (int)(fVar57 * (float)(int)uVar6);
            this->m_viewportWidth = iVar58;
            this->m_viewportHeight = iVar61;
            auVar13._4_4_ = -(uint)(0 < iVar58);
            auVar13._0_4_ = -(uint)(0 < iVar58);
            auVar13._8_4_ = -(uint)(0 < iVar61);
            auVar13._12_4_ = -(uint)(0 < iVar61);
            iVar58 = movmskpd(uVar24,auVar13);
            if (iVar58 != 3) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,
                         "Can\'t decrease viewport size enough to achieve low-enough draw times",
                         "m_viewportWidth >= 1 && m_viewportHeight >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x379);
LAB_011a202f:
              __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            ppVVar2 = &leftData.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            leftData.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pVVar10;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
            std::operator<<((ostream *)ppVVar2,
                            "Note: viewport size reduced from original; it\'s now smaller than during calibration."
                           );
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&leftData,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &leftData.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      prepareProgram(this,0);
      ppVVar2 = &leftData.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start = pVVar10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
      std::operator<<((ostream *)ppVVar2,"Grid size: ");
      pMVar36 = tcu::MessageBuilder::operator<<((MessageBuilder *)&leftData,&this->m_gridSizeX);
      std::operator<<(&(pMVar36->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
      pMVar36 = tcu::MessageBuilder::operator<<(pMVar36,&this->m_gridSizeY);
      tcu::MessageBuilder::operator<<(pMVar36,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
      ppVVar2 = &leftData.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      leftData.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start = pVVar10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
      std::operator<<((ostream *)ppVVar2,"Viewport: ");
      pMVar36 = tcu::MessageBuilder::operator<<((MessageBuilder *)&leftData,&this->m_viewportWidth);
      std::operator<<(&(pMVar36->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
      pMVar36 = tcu::MessageBuilder::operator<<(pMVar36,&this->m_viewportHeight);
      tcu::MessageBuilder::operator<<(pMVar36,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
      prepareNextRound(this);
      ((this->m_initialCalibrationStorage).m_ptr)->initialNumCalls =
           (this->m_calibrator).m_measureState.numDrawCalls;
    }
  }
  return IVar42;
}

Assistant:

OperatorPerformanceCase::IterateResult OperatorPerformanceCase::iterate (void)
{
	const TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState != TheilSenCalibrator::STATE_FINISHED)
	{
		if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
			m_calibrator.recomputeParameters();
		else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
			m_calibrator.recordIteration(renderAndMeasure(m_calibrator.getCallCount()));
		else
			DE_ASSERT(false);

		if (m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
		{
			logCalibrationInfo(m_testCtx.getLog(), m_calibrator);
			adjustAndLogGridAndViewport();
			prepareNextRound();
			m_initialCalibrationStorage->initialNumCalls = m_calibrator.getCallCount();
		}
	}
	else if (m_state == STATE_FIND_HIGH_WORKLOAD || m_state == STATE_MEASURING)
	{
		if (m_workloadMeasurementNdx < m_numMeasurementsPerWorkload)
		{
			vector<WorkloadRecord>& records = m_state == STATE_FIND_HIGH_WORKLOAD ? m_workloadRecordsFindHigh[m_measureProgramNdx] : m_workloadRecords[m_measureProgramNdx];
			records.back().addFrameTime((float)renderAndMeasure(m_calibrator.getCallCount()));
			m_workloadMeasurementNdx++;
		}
		else
			prepareNextRound();
	}
	else
	{
		DE_ASSERT(m_state == STATE_REPORTING);

		TestLog&	log				= m_testCtx.getLog();
		const int	drawCallCount	= m_calibrator.getCallCount();

		{
			// Compute per-program estimators for measurements.
			vector<SegmentedEstimator> estimators;
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
				estimators.push_back(computeSegmentedEstimator(getWorkloadMedianDataPoints(progNdx)));

			// Log measurements and their estimators for all programs.
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				const SegmentedEstimator&	estimator	= estimators[progNdx];
				const string				progNdxStr	= de::toString(progNdx);
				vector<WorkloadRecord>		records		= m_workloadRecords[progNdx];
				std::sort(records.begin(), records.end());

				{
					const tcu::ScopedLogSection section(log,
														"Program" + progNdxStr + "Measurements",
														"Measurements for program " + progNdxStr);

					// Sample list of individual frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "IndividualFrameTimes", "Individual frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",	"Workload",		"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("FrameTime",	"Frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						for (int j = 0; j < (int)records[i].frameTimes.size(); j++)
							log << TestLog::Sample << records[i].workloadSize << records[i].frameTimes[j] << TestLog::EndSample;

					log << TestLog::EndSampleList;

					// Sample list of median frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "MedianFrameTimes", "Median frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",		"Workload",				"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("MedianFrameTime",	"Median frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						log << TestLog::Sample << records[i].workloadSize << records[i].getMedianTime() << TestLog::EndSample;

					log << TestLog::EndSampleList;

					log << TestLog::Float("Program" + progNdxStr + "WorkloadCostEstimate", "Workload cost estimate", "us / workload", QP_KEY_TAG_TIME, estimator.right.coefficient);

					if (estimator.pivotX > -std::numeric_limits<float>::infinity())
						log << TestLog::Message << "Note: the data points with x coordinate greater than or equal to " << estimator.pivotX
												<< " seem to form a rising line, and the rest of data points seem to form a near-horizontal line" << TestLog::EndMessage
							<< TestLog::Message << "Note: the left line is estimated to be " << lineParamsString(estimator.left)
												<< " and the right line " << lineParamsString(estimator.right) << TestLog::EndMessage;
					else
						log << TestLog::Message << "Note: the data seem to form a single line: " << lineParamsString(estimator.right) << TestLog::EndMessage;
				}
			}

			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				if (estimators[progNdx].right.coefficient <= 0.0f)
				{
					log << TestLog::Message << "Slope of measurements for program " << progNdx << " isn't positive. Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			// \note For each estimator, .right.coefficient is the increase in draw time (in microseconds) when
			// incrementing shader workload size by 1, when D draw calls are done, with a vertex/fragment count
			// of R.
			//
			// The measurements of any single program can't tell us the final result (time of single operation),
			// so we use computeSingleOperationTime to compute it from multiple programs' measurements in a
			// subclass-defined manner.
			//
			// After that, microseconds per operation can be calculated as singleOperationTime / (D * R).

			{
				vector<float>	perProgramSlopes;
				for (int i = 0; i < (int)m_programs.size(); i++)
					perProgramSlopes.push_back(estimators[i].right.coefficient);

				logSingleOperationCalculationInfo();

				const float		maxSlope				= *std::max_element(perProgramSlopes.begin(), perProgramSlopes.end());
				const float		usecsPerFramePerOp		= computeSingleOperationTime(perProgramSlopes);
				const int		vertexOrFragmentCount	= m_caseType == CASETYPE_VERTEX ?
															getNumVertices(m_gridSizeX, m_gridSizeY) :
															m_viewportWidth*m_viewportHeight;
				const double	usecsPerDrawCallPerOp	= usecsPerFramePerOp / (double)drawCallCount;
				const double	usecsPerSingleOp		= usecsPerDrawCallPerOp / (double)vertexOrFragmentCount;
				const double	megaOpsPerSecond		= (double)(drawCallCount*vertexOrFragmentCount) / usecsPerFramePerOp;
				const int		numFreeOps				= de::max(0, (int)deFloatFloor(intersectionX(estimators[0].left,
																									 LineParameters(estimators[0].right.offset,
																													usecsPerFramePerOp))));

				log << TestLog::Integer("VertexOrFragmentCount",
										"R = " + string(m_caseType == CASETYPE_VERTEX ? "Vertex" : "Fragment") + " count",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount)

					<< TestLog::Integer("DrawCallsPerFrame", "D = Draw calls per frame", "", QP_KEY_TAG_NONE, drawCallCount)

					<< TestLog::Integer("VerticesOrFragmentsPerFrame",
										"R*D = " + string(m_caseType == CASETYPE_VERTEX ? "Vertices" : "Fragments") + " per frame",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount*drawCallCount)

					<< TestLog::Float("TimePerFramePerOp",
									  "Estimated cost of R*D " + string(m_caseType == CASETYPE_VERTEX ? "vertices" : "fragments")
									  + " (i.e. one frame) with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerFramePerOp)

					<< TestLog::Float("TimePerDrawcallPerOp",
									  "Estimated cost of one draw call with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerDrawCallPerOp)

					<< TestLog::Float("TimePerSingleOp",
									  "Estimated cost of a single shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerSingleOp);

				// \note Sometimes, when the operation is free or very cheap, it can happen that the shader with the operation runs,
				//		 for some reason, a bit faster than the shader without the operation, and thus we get a negative result. The
				//		 following threshold values for accepting a negative or almost-zero result are rather quick and dirty.
				if (usecsPerFramePerOp <= -0.1f*maxSlope)
				{
					log << TestLog::Message << "Got strongly negative result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
				else if (usecsPerFramePerOp <= 0.001*maxSlope)
				{
					log << TestLog::Message << "Cost of operation seems to be approximately zero." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
				}
				else
				{
					log << TestLog::Float("OpsPerSecond",
										  "Operations per second",
										  "Million/s", QP_KEY_TAG_PERFORMANCE, (float)megaOpsPerSecond)

						<< TestLog::Integer("NumFreeOps",
											"Estimated number of \"free\" operations",
											"", QP_KEY_TAG_PERFORMANCE, numFreeOps);

					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)megaOpsPerSecond, 2).c_str());
				}

				m_state = STATE_FINISHED;
			}
		}

		return STOP;
	}

	return CONTINUE;
}